

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O0

int ffldrc(fitsfile *fptr,long record,int err_mode,int *status)

{
  int iVar1;
  long local_48;
  LONGLONG rstart;
  int nbuff;
  int ibuff;
  int *status_local;
  long lStack_20;
  int err_mode_local;
  long record_local;
  fitsfile *fptr_local;
  
  _nbuff = status;
  status_local._4_4_ = err_mode;
  lStack_20 = record;
  record_local = (long)fptr;
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  for (rstart._4_4_ = 0x27; -1 < rstart._4_4_; rstart._4_4_ = rstart._4_4_ + -1) {
    rstart._0_4_ = *(int *)(*(long *)(record_local + 8) + 0x748 + (long)rstart._4_4_ * 4);
    if (lStack_20 == *(long *)(*(long *)(record_local + 8) + 0x568 + (long)(int)rstart * 8))
    goto LAB_00124e1e;
  }
  local_48 = lStack_20 * 0xb40;
  if ((status_local._4_4_ == 0) && (*(long *)(*(long *)(record_local + 8) + 0x30) <= local_48)) {
    *_nbuff = 0x6b;
    fptr_local._4_4_ = 0x6b;
  }
  else {
    iVar1 = ffwhbf((fitsfile *)record_local,(int *)&rstart);
    if (iVar1 < 0) {
      *_nbuff = 0x67;
      fptr_local._4_4_ = 0x67;
    }
    else {
      if (*(int *)(*(long *)(record_local + 8) + 0x6a8 + (long)(int)rstart * 4) != 0) {
        ffbfwt(*(FITSfile **)(record_local + 8),(int)rstart,_nbuff);
      }
      if (local_48 < *(long *)(*(long *)(record_local + 8) + 0x28)) {
        if (*(long *)(*(long *)(record_local + 8) + 0x48) != local_48) {
          ffseek(*(FITSfile **)(record_local + 8),local_48);
        }
        ffread(*(FITSfile **)(record_local + 8),0xb40,
               (void *)(*(long *)(*(long *)(record_local + 8) + 0x560) + (long)((int)rstart * 0xb40)
                       ),_nbuff);
        *(long *)(*(long *)(record_local + 8) + 0x48) = local_48 + 0xb40;
      }
      else {
        if (*(int *)(*(long *)(record_local + 8) + 0x58) == 1) {
          memset((void *)(*(long *)(*(long *)(record_local + 8) + 0x560) +
                         (long)((int)rstart * 0xb40)),0x20,0xb40);
        }
        else {
          memset((void *)(*(long *)(*(long *)(record_local + 8) + 0x560) +
                         (long)((int)rstart * 0xb40)),0,0xb40);
        }
        if (local_48 + 0xb40 < *(long *)(*(long *)(record_local + 8) + 0x30)) {
          local_48 = *(long *)(*(long *)(record_local + 8) + 0x30);
        }
        else {
          local_48 = local_48 + 0xb40;
        }
        *(long *)(*(long *)(record_local + 8) + 0x30) = local_48;
        *(undefined4 *)(*(long *)(record_local + 8) + 0x6a8 + (long)(int)rstart * 4) = 1;
      }
      *(long *)(*(long *)(record_local + 8) + 0x568 + (long)(int)rstart * 8) = lStack_20;
LAB_00124e1e:
      *(int *)(*(long *)(record_local + 8) + 0x50) = (int)rstart;
      iVar1 = rstart._4_4_;
      if (rstart._4_4_ < 0) {
        rstart._4_4_ = 0;
        while ((iVar1 = rstart._4_4_, rstart._4_4_ < 0x28 &&
               (*(int *)(*(long *)(record_local + 8) + 0x748 + (long)rstart._4_4_ * 4) !=
                (int)rstart))) {
          rstart._4_4_ = rstart._4_4_ + 1;
        }
      }
      while (rstart._4_4_ = iVar1 + 1, rstart._4_4_ < 0x28) {
        *(undefined4 *)(*(long *)(record_local + 8) + 0x748 + (long)iVar1 * 4) =
             *(undefined4 *)(*(long *)(record_local + 8) + 0x748 + (long)rstart._4_4_ * 4);
        iVar1 = rstart._4_4_;
      }
      *(int *)(*(long *)(record_local + 8) + 0x7e4) = (int)rstart;
      fptr_local._4_4_ = *_nbuff;
    }
  }
  return fptr_local._4_4_;
}

Assistant:

int ffldrc(fitsfile *fptr,        /* I - FITS file pointer             */
           long record,           /* I - record number to be loaded    */
           int err_mode,          /* I - 1=ignore EOF, 0 = return EOF error */
           int *status)           /* IO - error status                 */
{
/*
  low-level routine to load a specified record from a file into
  a physical buffer, if it is not already loaded.  Reset all
  pointers to make this the new current record for that file.
  Update ages of all the physical buffers.
*/
    int ibuff, nbuff;
    LONGLONG rstart;

    /* check if record is already loaded in one of the buffers */
    /* search from youngest to oldest buffer for efficiency */

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    for (ibuff = NIOBUF - 1; ibuff >= 0; ibuff--)
    {
      nbuff = (fptr->Fptr)->ageindex[ibuff];
      if (record == (fptr->Fptr)->bufrecnum[nbuff]) {
         goto updatebuf;  /* use 'goto' for efficiency */
      }
    }

    /* record is not already loaded */
    rstart = (LONGLONG)record * IOBUFLEN;

    if ( !err_mode && (rstart >= (fptr->Fptr)->logfilesize) )  /* EOF? */
         return(*status = END_OF_FILE);

    if (ffwhbf(fptr, &nbuff) < 0)  /* which buffer should we reuse? */
       return(*status = TOO_MANY_FILES); 

    if ((fptr->Fptr)->dirty[nbuff])
       ffbfwt(fptr->Fptr, nbuff, status); /* write dirty buffer to disk */

    if (rstart >= (fptr->Fptr)->filesize)  /* EOF? */
    {
      /* initialize an empty buffer with the correct fill value */
      if ((fptr->Fptr)->hdutype == ASCII_TBL)
         memset((fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN), 32, IOBUFLEN); /* blank fill */
      else
         memset((fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN),  0, IOBUFLEN);  /* zero fill */

      (fptr->Fptr)->logfilesize = maxvalue((fptr->Fptr)->logfilesize, 
              rstart + IOBUFLEN);

      (fptr->Fptr)->dirty[nbuff] = TRUE;  /* mark record as having been modified */
    }
    else  /* not EOF, so read record from disk */
    {
      if ((fptr->Fptr)->io_pos != rstart)
           ffseek(fptr->Fptr, rstart);

      ffread(fptr->Fptr, IOBUFLEN, (fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN), status);
      (fptr->Fptr)->io_pos = rstart + IOBUFLEN;  /* set new IO position */
    }

    (fptr->Fptr)->bufrecnum[nbuff] = record;   /* record number contained in buffer */

updatebuf:

    (fptr->Fptr)->curbuf = nbuff; /* this is the current buffer for this file */

    if (ibuff < 0)
    { 
      /* find the current position of the buffer in the age index */
      for (ibuff = 0; ibuff < NIOBUF; ibuff++)
         if ((fptr->Fptr)->ageindex[ibuff] == nbuff)
            break;  
    }

    /* increment the age of all the buffers that were younger than it */
    for (ibuff++; ibuff < NIOBUF; ibuff++)
      (fptr->Fptr)->ageindex[ibuff - 1] = (fptr->Fptr)->ageindex[ibuff];

    (fptr->Fptr)->ageindex[NIOBUF - 1] = nbuff; /* this is now the youngest buffer */
    return(*status);
}